

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parson.c
# Opt level: O3

JSON_Value * json_value_init_string_with_len(char *string,size_t length)

{
  byte bVar1;
  char *__dest;
  JSON_Value *pJVar2;
  byte *pbVar3;
  
  if (string == (char *)0x0) {
    return (JSON_Value *)0x0;
  }
  if (0 < (long)length) {
    pbVar3 = (byte *)string;
    do {
      bVar1 = *pbVar3;
      if (0xf4 < bVar1) {
        return (JSON_Value *)0x0;
      }
      if ((bVar1 & 0xfe) == 0xc0) {
        return (JSON_Value *)0x0;
      }
      if ((bVar1 & 0xc0) == 0x80) {
        return (JSON_Value *)0x0;
      }
      if ((char)bVar1 < '\0') {
        return (JSON_Value *)0x0;
      }
      pbVar3 = pbVar3 + 1;
    } while (pbVar3 < string + length);
  }
  __dest = (char *)(*parson_malloc)(length + 1);
  if (__dest != (char *)0x0) {
    __dest[length] = '\0';
    memcpy(__dest,string,length);
    pJVar2 = (JSON_Value *)(*parson_malloc)(0x20);
    if (pJVar2 != (JSON_Value *)0x0) {
      pJVar2->parent = (JSON_Value *)0x0;
      pJVar2->type = 2;
      (pJVar2->value).string.chars = __dest;
      (pJVar2->value).string.length = length;
      return pJVar2;
    }
    (*parson_free)(__dest);
  }
  return (JSON_Value *)0x0;
}

Assistant:

JSON_Value * json_value_init_string_with_len(const char *string, size_t length) {
    char *copy = NULL;
    JSON_Value *value;
    if (string == NULL) {
        return NULL;
    }
    if (!is_valid_utf8(string, length)) {
        return NULL;
    }
    copy = parson_strndup(string, length);
    if (copy == NULL) {
        return NULL;
    }
    value = json_value_init_string_no_copy(copy, length);
    if (value == NULL) {
        parson_free(copy);
    }
    return value;
}